

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O3

void __thiscall
wasm::StructUtils::
StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>::
noteExpressionOrCopy
          (StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
           *this,Expression *expr,HeapType type,Index index,PossibleConstantValues *info)

{
  PassRunner *pPVar1;
  Module *module;
  size_t sVar2;
  pointer pBVar3;
  key_type pFVar4;
  key_type pFVar5;
  Expression **ppEVar6;
  HeapType HVar7;
  mapped_type *this_00;
  StructValues<wasm::(anonymous_namespace)::Bool> *pSVar8;
  key_type local_50;
  StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner> *local_48;
  HeapType local_40;
  Index local_34;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
           ).super_Pass.runner;
  module = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
           ).
           super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
           .
           super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
           .currModule;
  pFVar4 = (key_type)expr;
  local_48 = this;
  local_40.id = type.id;
  local_34 = index;
  do {
    pFVar5 = pFVar4;
    local_50 = pFVar5;
    ppEVar6 = Properties::getImmediateFallthroughPtr
                        ((Expression **)&local_50,&pPVar1->options,module,AllowTeeBrIf);
    pFVar4 = (key_type)*ppEVar6;
  } while ((key_type)*ppEVar6 != pFVar5);
  if (((Type *)&(pFVar5->super_Importable).super_Named.name.super_IString.str._M_str)->id ==
      (expr->type).id) {
    expr = (Expression *)pFVar5;
  }
  if ((((*(Id *)&(((key_type)expr)->super_Importable).super_Named.name.super_IString.str._M_len ==
         StructGetId) &&
       (*(Index *)&(((key_type)expr)->super_Importable).super_Named.hasExplicitName == local_34)) &&
      (sVar2 = (((key_type)expr)->super_Importable).module.super_IString.str._M_len,
      *(long *)(sVar2 + 8) != 1)) &&
     (HVar7 = wasm::Type::getHeapType((Type *)(sVar2 + 8)), HVar7.id == local_40.id)) {
    local_50 = (local_48->
               super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
               ).
               super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               .
               super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               .currFunction;
    this_00 = std::
              unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
              ::operator[]((unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
                            *)local_48[1].
                              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                              .super_Pass._vptr_Pass,&local_50);
    pSVar8 = StructValuesMap<wasm::(anonymous_namespace)::Bool>::operator[](this_00,local_40);
    pBVar3 = (pSVar8->
             super_vector<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
             ).
             super__Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)local_34 <
        (ulong)((long)(pSVar8->
                      super_vector<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                      ).
                      super__Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3)) {
      pBVar3[local_34].value = true;
      return;
    }
    __assert_fail("index < this->size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                  ,0x27,
                  "T &wasm::StructUtils::StructValues<wasm::(anonymous namespace)::Bool>::operator[](size_t) [T = wasm::(anonymous namespace)::Bool]"
                 );
  }
  PossibleConstantValues::note
            (info,expr,
             (local_48->
             super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
             ).
             super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
             .
             super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
             .currModule);
  return;
}

Assistant:

void
  noteExpressionOrCopy(Expression* expr, HeapType type, Index index, T& info) {
    // Look at the value falling through, if it has the exact same type
    // (otherwise, we'd need to consider both the type actually written and the
    // type of the fallthrough, somehow).
    auto* fallthrough = Properties::getFallthrough(
      expr,
      this->getPassOptions(),
      *this->getModule(),
      static_cast<SubType*>(this)->getFallthroughBehavior());
    if (fallthrough->type == expr->type) {
      expr = fallthrough;
    }
    if (auto* get = expr->dynCast<StructGet>()) {
      if (get->index == index && get->ref->type != Type::unreachable &&
          get->ref->type.getHeapType() == type) {
        static_cast<SubType*>(this)->noteCopy(type, index, info);
        return;
      }
    }
    static_cast<SubType*>(this)->noteExpression(expr, type, index, info);
  }